

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

unique_ptr<LoopStatement,_std::default_delete<LoopStatement>_> __thiscall Parser::loop(Parser *this)

{
  logic_error *this_00;
  undefined8 *in_RSI;
  __uniq_ptr_impl<LoopStatement,_std::default_delete<LoopStatement>_> local_68;
  Token local_60;
  vector<std::unique_ptr<Statement,_std::default_delete<Statement>_>,_std::allocator<std::unique_ptr<Statement,_std::default_delete<Statement>_>_>_>
  local_48;
  
  local_48.
  super__Vector_base<std::unique_ptr<Statement,_std::default_delete<Statement>_>,_std::allocator<std::unique_ptr<Statement,_std::default_delete<Statement>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<std::unique_ptr<Statement,_std::default_delete<Statement>_>,_std::allocator<std::unique_ptr<Statement,_std::default_delete<Statement>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<std::unique_ptr<Statement,_std::default_delete<Statement>_>,_std::allocator<std::unique_ptr<Statement,_std::default_delete<Statement>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  TokenStream::next(&local_60,(TokenStream *)*in_RSI);
  while( true ) {
    while( true ) {
      TokenStream::lookahead(&local_60,(TokenStream *)*in_RSI);
      if (local_60.type != LeftBracket) break;
      loop((Parser *)&local_68);
      local_60.span.begin =
           (unsigned_long_long)
           local_68._M_t.
           super__Tuple_impl<0UL,_LoopStatement_*,_std::default_delete<LoopStatement>_>.
           super__Head_base<0UL,_LoopStatement_*,_false>._M_head_impl;
      local_68._M_t.super__Tuple_impl<0UL,_LoopStatement_*,_std::default_delete<LoopStatement>_>.
      super__Head_base<0UL,_LoopStatement_*,_false>._M_head_impl =
           (tuple<LoopStatement_*,_std::default_delete<LoopStatement>_>)
           (_Tuple_impl<0UL,_LoopStatement_*,_std::default_delete<LoopStatement>_>)0x0;
      std::
      vector<std::unique_ptr<Statement,std::default_delete<Statement>>,std::allocator<std::unique_ptr<Statement,std::default_delete<Statement>>>>
      ::emplace_back<std::unique_ptr<Statement,std::default_delete<Statement>>>
                ((vector<std::unique_ptr<Statement,std::default_delete<Statement>>,std::allocator<std::unique_ptr<Statement,std::default_delete<Statement>>>>
                  *)&local_48,(unique_ptr<Statement,_std::default_delete<Statement>_> *)&local_60);
      std::unique_ptr<Statement,_std::default_delete<Statement>_>::~unique_ptr
                ((unique_ptr<Statement,_std::default_delete<Statement>_> *)&local_60);
      std::unique_ptr<LoopStatement,_std::default_delete<LoopStatement>_>::~unique_ptr
                ((unique_ptr<LoopStatement,_std::default_delete<LoopStatement>_> *)&local_68);
    }
    if (local_60.type == RightBracket) break;
    if (local_60.type == EndOfFile) {
      this_00 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error(this_00,"Unexpected end of input");
      __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    single((Parser *)&local_60);
    std::
    vector<std::unique_ptr<Statement,std::default_delete<Statement>>,std::allocator<std::unique_ptr<Statement,std::default_delete<Statement>>>>
    ::emplace_back<std::unique_ptr<Statement,std::default_delete<Statement>>>
              ((vector<std::unique_ptr<Statement,std::default_delete<Statement>>,std::allocator<std::unique_ptr<Statement,std::default_delete<Statement>>>>
                *)&local_48,(unique_ptr<Statement,_std::default_delete<Statement>_> *)&local_60);
    std::unique_ptr<Statement,_std::default_delete<Statement>_>::~unique_ptr
              ((unique_ptr<Statement,_std::default_delete<Statement>_> *)&local_60);
  }
  TokenStream::next(&local_60,(TokenStream *)*in_RSI);
  std::
  make_unique<LoopStatement,std::vector<std::unique_ptr<Statement,std::default_delete<Statement>>,std::allocator<std::unique_ptr<Statement,std::default_delete<Statement>>>>>
            ((vector<std::unique_ptr<Statement,_std::default_delete<Statement>_>,_std::allocator<std::unique_ptr<Statement,_std::default_delete<Statement>_>_>_>
              *)this);
  std::
  vector<std::unique_ptr<Statement,_std::default_delete<Statement>_>,_std::allocator<std::unique_ptr<Statement,_std::default_delete<Statement>_>_>_>
  ::~vector(&local_48);
  return (__uniq_ptr_data<LoopStatement,_std::default_delete<LoopStatement>,_true,_true>)
         (__uniq_ptr_data<LoopStatement,_std::default_delete<LoopStatement>,_true,_true>)this;
}

Assistant:

auto Parser::loop() -> std::unique_ptr<LoopStatement> {
    auto statements = std::vector<std::unique_ptr<Statement>>();
    tokenStream.next(); // Consume left bracket token.

    TokenKind lookahead;
    while ((lookahead = tokenStream.lookahead().type) != TokenKind::RightBracket) {
        if (lookahead == TokenKind::EndOfFile)
            throw std::logic_error("Unexpected end of input");

        if (lookahead == TokenKind::LeftBracket)
            statements.push_back(loop());
        else statements.push_back(single());
    }

    tokenStream.next(); // Consume right bracket token.
    return std::make_unique<LoopStatement>(std::move(statements));
}